

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCTestBinPacker.cxx
# Opt level: O0

int testCTestBinPacker(int param_1,char **param_2)

{
  bool bVar1;
  reference this;
  ostream *poVar2;
  reference expected_00;
  ExpectedPackResult *expected;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<ExpectedPackResult,_std::allocator<ExpectedPackResult>_> *__range1_1;
  AllocationComparison *comparison;
  const_iterator __end1;
  const_iterator __begin1;
  vector<AllocationComparison,_std::allocator<AllocationComparison>_> *__range1;
  int retval;
  char **param_1_local;
  int param_0_local;
  
  __range1._4_4_ = 0;
  __end1 = std::vector<AllocationComparison,_std::allocator<AllocationComparison>_>::begin
                     (&comparisons);
  comparison = (AllocationComparison *)
               std::vector<AllocationComparison,_std::allocator<AllocationComparison>_>::end
                         (&comparisons);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_AllocationComparison_*,_std::vector<AllocationComparison,_std::allocator<AllocationComparison>_>_>
                                *)&comparison);
    if (!bVar1) break;
    this = __gnu_cxx::
           __normal_iterator<const_AllocationComparison_*,_std::vector<AllocationComparison,_std::allocator<AllocationComparison>_>_>
           ::operator*(&__end1);
    bVar1 = cmCTestBinPackerAllocation::operator==(&this->First,&this->Second);
    if (bVar1 != (bool)(this->Equal & 1U)) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Comparison did not match expected");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      __range1._4_4_ = 1;
    }
    bVar1 = cmCTestBinPackerAllocation::operator!=(&this->First,&this->Second);
    if (bVar1 == (bool)(this->Equal & 1U)) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Comparison did not match expected");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      __range1._4_4_ = 1;
    }
    __gnu_cxx::
    __normal_iterator<const_AllocationComparison_*,_std::vector<AllocationComparison,_std::allocator<AllocationComparison>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<ExpectedPackResult,_std::allocator<ExpectedPackResult>_>::begin
                       (&expectedResults);
  expected = (ExpectedPackResult *)
             std::vector<ExpectedPackResult,_std::allocator<ExpectedPackResult>_>::end
                       (&expectedResults);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_ExpectedPackResult_*,_std::vector<ExpectedPackResult,_std::allocator<ExpectedPackResult>_>_>
                        *)&expected);
    if (!bVar1) break;
    expected_00 = __gnu_cxx::
                  __normal_iterator<const_ExpectedPackResult_*,_std::vector<ExpectedPackResult,_std::allocator<ExpectedPackResult>_>_>
                  ::operator*(&__end1_1);
    bVar1 = TestExpectedPackResult(expected_00);
    if (!bVar1) {
      __range1._4_4_ = 1;
    }
    __gnu_cxx::
    __normal_iterator<const_ExpectedPackResult_*,_std::vector<ExpectedPackResult,_std::allocator<ExpectedPackResult>_>_>
    ::operator++(&__end1_1);
  }
  return __range1._4_4_;
}

Assistant:

int testCTestBinPacker(int /*unused*/, char* /*unused*/ [])
{
  int retval = 0;

  for (auto const& comparison : comparisons) {
    if ((comparison.First == comparison.Second) != comparison.Equal) {
      std::cout << "Comparison did not match expected" << std::endl;
      retval = 1;
    }
    if ((comparison.First != comparison.Second) == comparison.Equal) {
      std::cout << "Comparison did not match expected" << std::endl;
      retval = 1;
    }
  }

  for (auto const& expected : expectedResults) {
    if (!TestExpectedPackResult(expected)) {
      retval = 1;
    }
  }

  return retval;
}